

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

float duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<double,float>
                (double input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  duckdb *this;
  float value;
  string local_40;
  
  this = (duckdb *)idx;
  bVar1 = Value::IsFinite<double>(input);
  value = (float)input;
  if (bVar1) {
    bVar1 = Value::FloatIsFinite(value);
    if (!bVar1) {
      CastExceptionText<double,float>(&local_40,this,input);
      value = HandleVectorCastError::Operation<float>
                        (&local_40,mask,idx,(VectorTryCastData *)dataptr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
  }
  return value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}